

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O3

void __thiscall vec<BoolView>::~vec(vec<BoolView> *this)

{
  long lVar1;
  ulong uVar2;
  
  if (this->sz != 0) {
    lVar1 = 0;
    uVar2 = 0;
    do {
      (**(code **)(*(long *)((long)&(this->data->super_Var).super_Branching._vptr_Branching + lVar1)
                  + 0x28))((long)&(this->data->super_Var).super_Branching._vptr_Branching + lVar1);
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x10;
    } while (uVar2 < this->sz);
  }
  if (this->data != (BoolView *)0x0) {
    free(this->data);
  }
  this->data = (BoolView *)0x0;
  return;
}

Assistant:

~vec() {
		for (unsigned int i = 0; i < sz; i++) {
			data[i].~T();
		}
		if (data) {
			free(data);
		}
		data = nullptr;
	}